

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O1

bool Cipher::loadFreqMap(char *fname,TFreqMap *res,double pmin)

{
  char cVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  double dVar4;
  pointer piVar5;
  mapped_type mVar6;
  istream *piVar7;
  char *pcVar8;
  mapped_type *pmVar9;
  long lVar10;
  mapped_type *pmVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  __node_base _Var16;
  ulong uVar17;
  int *mask;
  uint *puVar18;
  int iVar19;
  bool bVar20;
  mapped_type mVar21;
  vector<int,_std::allocator<int>_> masks;
  int64_t nfreq;
  string gram;
  TCode idx;
  unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
  pi64;
  ifstream fin;
  vector<int,_std::allocator<int>_> local_308;
  long local_2f0;
  mapped_type local_2e8;
  uint local_2dc;
  _Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_2d8;
  double local_2d0;
  char *local_2c8;
  undefined8 local_2c0;
  char local_2b8;
  undefined7 uStack_2b7;
  _Hashtable<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_2a8;
  _Hashtable<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_270;
  long local_238 [4];
  byte abStack_218 [488];
  
  res->len = 0;
  local_2d0 = pmin;
  std::
  _Hashtable<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(res->prob)._M_h);
  printf("[+] Loading n-gram file \'%s\'\n",fname);
  std::ifstream::ifstream(local_238,fname,_S_in);
  if (*(int *)(abStack_218 + *(long *)(local_238[0] + -0x18)) != 0) {
    puts("    Failed to open file");
    bVar20 = false;
    goto LAB_00118eaa;
  }
  local_2c8 = &local_2b8;
  local_2c0 = 0;
  local_2b8 = '\0';
  local_2e8 = 0;
  res->nTotal = 0;
  local_270._M_buckets = &local_270._M_single_bucket;
  local_270._M_bucket_count = 1;
  local_270._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_270._M_element_count = 0;
  local_270._M_rehash_policy._M_max_load_factor = 1.0;
  local_270._M_rehash_policy._M_next_resize = 0;
  local_270._M_single_bucket = (__node_base_ptr)0x0;
  local_2d8 = (_Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)&res->prob;
  while( true ) {
    piVar7 = std::operator>>((istream *)local_238,(string *)&local_2c8);
    std::istream::_M_extract<long>((long *)piVar7);
    if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) != 0) break;
    if (res->len == 0) {
      res->len = (int)local_2c0;
    }
    else if (res->len != (int)local_2c0) {
      puts("Error: loaded n-grams with vaying lengths");
      goto LAB_00118e7f;
    }
    iVar12 = res->len + 1;
    iVar14 = 0;
    pcVar8 = local_2c8;
    do {
      cVar1 = *pcVar8;
      pcVar8 = pcVar8 + 1;
      iVar14 = iVar14 * 0x20 + *(int *)((anonymous_namespace)::kCharToLetter + (long)cVar1 * 4);
      iVar12 = iVar12 + -1;
    } while (1 < iVar12);
    local_2a8._M_buckets = (__buckets_ptr)CONCAT44(local_2a8._M_buckets._4_4_,iVar14);
    pmVar9 = std::__detail::
             _Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_270,(key_type *)&local_2a8);
    mVar6 = local_2e8;
    if (0 < *pmVar9) {
      printf("Error: duplicate n-gram \'%s\'\n",local_2c8);
      goto LAB_00118e7f;
    }
    pmVar9 = std::__detail::
             _Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_270,(key_type *)&local_2a8);
    *pmVar9 = mVar6;
    res->nTotal = res->nTotal + local_2e8;
  }
  printf("    Total n-grams loaded = %g\n",SUB84((double)res->nTotal,0));
  local_2f0 = std::chrono::_V2::steady_clock::now();
  std::vector<int,_std::allocator<int>_>::vector
            (&local_308,(ulong)(uint)~(-1 << ((byte)res->len & 0x1f)),(allocator_type *)&local_2a8);
  if (0 < (int)((ulong)((long)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2)) {
    uVar17 = 0;
    do {
      piVar5 = local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar17] = 0;
      if (0 < res->len) {
        iVar12 = 0;
        uVar13 = 0x1f;
        uVar15 = uVar17 & 0xffffffff;
        do {
          if ((uVar15 & 1) != 0) {
            local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar17] =
                 local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar17] | uVar13;
          }
          uVar15 = uVar15 >> 1;
          uVar13 = uVar13 << 5;
          iVar12 = iVar12 + 1;
        } while (iVar12 < res->len);
      }
      printf("    Mask %2d: ",uVar17 & 0xffffffff);
      if (0 < res->len) {
        iVar12 = res->len * 5;
        iVar19 = 0;
        iVar14 = -1;
        do {
          printf("%d",(ulong)(((uint)piVar5[uVar17] >> (iVar12 + iVar14 & 0x1fU) & 1) != 0));
          iVar19 = iVar19 + 1;
          iVar12 = res->len * 5;
          iVar14 = iVar14 + -1;
        } while (SBORROW4(iVar19,iVar12) != iVar19 + res->len * -5 < 0);
      }
      putchar(10);
      uVar17 = uVar17 + 1;
    } while ((long)uVar17 <
             (long)(int)((ulong)((long)local_308.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_308.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  local_2a8._M_buckets = &local_2a8._M_single_bucket;
  local_2a8._M_bucket_count = 1;
  local_2a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2a8._M_element_count = 0;
  local_2a8._M_rehash_policy._M_max_load_factor = 1.0;
  local_2a8._M_rehash_policy._M_next_resize = 0;
  local_2a8._M_single_bucket = (__node_base_ptr)0x0;
  bVar20 = local_270._M_before_begin._M_nxt == (_Hash_node_base *)0x0;
  if (!bVar20) {
    _Var16._M_nxt = local_270._M_before_begin._M_nxt;
    do {
      piVar5 = local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      p_Var2 = _Var16._M_nxt[2]._M_nxt;
      puVar18 = (uint *)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
      if (p_Var2 == (_Hash_node_base *)0x0) {
        printf("i = %d, p == 0 - should not happen\n",(ulong)*(uint *)&_Var16._M_nxt[1]._M_nxt);
      }
      else {
        for (; puVar18 != (uint *)piVar5; puVar18 = puVar18 + 1) {
          p_Var3 = _Var16._M_nxt[2]._M_nxt;
          local_2dc = *puVar18 & *(uint *)&_Var16._M_nxt[1]._M_nxt;
          pmVar9 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_2a8,(key_type *)&local_2dc);
          *pmVar9 = (long)&p_Var3->_M_nxt + *pmVar9;
        }
      }
      if (p_Var2 == (_Hash_node_base *)0x0) {
        std::
        _Hashtable<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_2a8);
        goto LAB_00118e68;
      }
      _Var16._M_nxt = (_Var16._M_nxt)->_M_nxt;
      bVar20 = _Var16._M_nxt == (_Hash_node_base *)0x0;
    } while (!bVar20);
  }
  printf("Size of pwild = %d\n",local_2a8._M_element_count & 0xffffffff);
  if (local_2a8._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var16._M_nxt = local_2a8._M_before_begin._M_nxt;
    do {
      p_Var2 = _Var16._M_nxt[2]._M_nxt;
      pmVar9 = std::__detail::
               _Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_270,(key_type *)(_Var16._M_nxt + 1));
      *pmVar9 = (mapped_type)p_Var2;
      _Var16._M_nxt = (_Var16._M_nxt)->_M_nxt;
    } while (_Var16._M_nxt != (_Hash_node_base *)0x0);
  }
  printf("Size of pi64 = %d\n",local_270._M_element_count & 0xffffffff);
  std::
  _Hashtable<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_2a8);
  if (bVar20) {
    local_2a8._M_buckets = (__buckets_ptr)((ulong)local_2a8._M_buckets & 0xffffffff00000000);
    pmVar9 = std::__detail::
             _Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_270,(key_type *)&local_2a8);
    if (*pmVar9 != res->nTotal) {
      local_2a8._M_buckets = (__buckets_ptr)((ulong)local_2a8._M_buckets & 0xffffffff00000000);
      pmVar9 = std::__detail::
               _Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_270,(key_type *)&local_2a8);
      printf("Error: wildcard probability mismatch - p[0] = %ld, expected %ld\n",*pmVar9,res->nTotal
            );
      goto LAB_00118e68;
    }
    lVar10 = std::chrono::_V2::steady_clock::now();
    printf("    Wildcard probabilities computed in %g ms\n",
           SUB84((double)((lVar10 - local_2f0) / 1000000),0));
    if ((uint *)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_2f0 = std::chrono::_V2::steady_clock::now();
    dVar4 = log10(local_2d0);
    res->pmin = (float)dVar4;
    printf("    P-min = %g\n",SUB84((double)(float)dVar4,0));
    for (_Var16._M_nxt = local_270._M_before_begin._M_nxt;
        bVar20 = _Var16._M_nxt == (_Hash_node_base *)0x0, !bVar20;
        _Var16._M_nxt = (_Var16._M_nxt)->_M_nxt) {
      p_Var2 = _Var16._M_nxt + 1;
      p_Var3 = _Var16._M_nxt[2]._M_nxt;
      if (p_Var3 == (_Hash_node_base *)0x0) {
        printf("i = %d, p == 0 - should not happen\n",(ulong)*(uint *)&p_Var2->_M_nxt);
      }
      else {
        dVar4 = (double)(long)p_Var3 / (double)res->nTotal;
        if (local_2d0 <= dVar4) {
          dVar4 = log10(dVar4);
          pmVar11 = std::__detail::
                    _Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](local_2d8,(key_type *)p_Var2);
          mVar21 = (mapped_type)dVar4;
        }
        else {
          mVar21 = res->pmin;
          pmVar11 = std::__detail::
                    _Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](local_2d8,(key_type *)p_Var2);
        }
        *pmVar11 = mVar21;
      }
      if (p_Var3 == (_Hash_node_base *)0x0) goto LAB_00118e81;
    }
    lVar10 = std::chrono::_V2::steady_clock::now();
    printf("    Probability computation time = %g ms\n",
           SUB84((double)((lVar10 - local_2f0) / 1000000),0));
  }
  else {
LAB_00118e68:
    if ((uint *)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
LAB_00118e7f:
    bVar20 = false;
  }
LAB_00118e81:
  std::
  _Hashtable<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_270);
  if (local_2c8 != &local_2b8) {
    operator_delete(local_2c8,CONCAT71(uStack_2b7,local_2b8) + 1);
  }
LAB_00118eaa:
  std::ifstream::~ifstream(local_238);
  return bVar20;
}

Assistant:

bool loadFreqMap(const char * fname, TFreqMap & res, double pmin) {
        auto & len = res.len;
        auto & prob = res.prob;

        len = 0;
        prob.clear();

        printf("[+] Loading n-gram file '%s'\n", fname);
        std::ifstream fin(fname);

        if (fin.good() == false) {
            printf("    Failed to open file\n");
            return false;
        }

        std::string gram;
        int64_t nfreq = 0;
        res.nTotal = 0;

        std::unordered_map<TCode, int64_t> pi64;

        while (true) {
            fin >> gram >> nfreq;
            if (fin.eof()) break;

            if (len == 0) {
                len = gram.size();
            } else if (len != (int) gram.size()) {
                printf("Error: loaded n-grams with vaying lengths\n");
                return false;
            }

            TCode idx = calcCode(gram.data(), len);
            if (pi64[idx] > 0) {
                printf("Error: duplicate n-gram '%s'\n", gram.c_str());
                return false;
            }
            pi64[idx] = nfreq;
            res.nTotal += nfreq;
        }
        printf("    Total n-grams loaded = %g\n", (double) res.nTotal);

        // compute wildcard frequencies
        {
            const auto tStart = std::chrono::steady_clock::now();

            std::vector<int32_t> masks((1 << len) - 1);
            for (int m = 0; m < (int) masks.size(); ++m) {
                auto & mask = masks[m];

                mask = 0;
                int32_t l = 0b11111;
                int32_t mm = m;
                for (int i = 0; i < len; ++i) {
                    if (mm & 1) {
                        mask |= l;
                    }
                    mm >>= 1;
                    l <<= 5;
                }

                // print mask in binary
                printf("    Mask %2d: ", m);
                for (int i = 0; i < 5*len; ++i) {
                    printf("%d", (mask >> (5*len - 1 - i)) & 1);
                }
                printf("\n");
            }

            {
                std::unordered_map<TCode, int64_t> pwild;
                for (const auto & [i, p] : pi64) {
                    if (p == 0) {
                        printf("i = %d, p == 0 - should not happen\n", i);
                        return false;
                    }

                    for (const auto & mask : masks) {
                        pwild[i & mask] += p;
                    }
                }

                printf("Size of pwild = %d\n", (int) pwild.size());

                for (auto & [i, p] : pwild) {
                    pi64[i] = p;
                }

                printf("Size of pi64 = %d\n", (int) pi64.size());
            }

            if (pi64[0] != res.nTotal) {
                printf("Error: wildcard probability mismatch - p[0] = %ld, expected %ld\n", (long) pi64[0], (long) res.nTotal);
                return false;
            }

            const auto tEnd = std::chrono::steady_clock::now();
            const auto tDiff = std::chrono::duration_cast<std::chrono::milliseconds>(tEnd - tStart).count();
            printf("    Wildcard probabilities computed in %g ms\n", (double) tDiff);
        }

        // compute probabilities
        {
            const auto tStart = std::chrono::steady_clock::now();

            res.pmin = std::log10(pmin);
            printf("    P-min = %g\n", res.pmin);

            for (auto & [i, p] : pi64) {
                if (p == 0) {
                    printf("i = %d, p == 0 - should not happen\n", i);
                    return false;
                } else {
                    double pp = double(p)/res.nTotal;
                    if (pp < pmin) {
                        prob[i] = res.pmin;
                    } else {
                        prob[i] = std::log10(pp);
                    }
                }
            }

            const auto tEnd = std::chrono::steady_clock::now();
            const auto tDiff = std::chrono::duration_cast<std::chrono::milliseconds>(tEnd - tStart).count();
            printf("    Probability computation time = %g ms\n", (double) tDiff);
        }

        return true;
    }